

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
emplace_back<slang::ast::ForeachLoopStatement::LoopDim>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,LoopDim *args)

{
  iterator pLVar1;
  LoopDim *args_local;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this_local;
  
  if (this->len == this->cap) {
    pLVar1 = end(this);
    this_local = (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)
                 emplaceRealloc<slang::ast::ForeachLoopStatement::LoopDim>(this,pLVar1,args);
  }
  else {
    pLVar1 = end(this);
    (pLVar1->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ConstantRange>._M_payload =
         (args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ConstantRange>._M_payload;
    *(undefined8 *)
     &(pLVar1->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_engaged =
         *(undefined8 *)
          &(args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange>._M_engaged;
    pLVar1->loopVar = args->loopVar;
    this->len = this->len + 1;
    this_local = (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)back(this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }